

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opengl3.cpp
# Opt level: O1

void ImGui_ImplOpenGL3_RenderDrawData(ImDrawData *draw_data)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  GLsizei GVar5;
  ImDrawList *pIVar6;
  ImDrawCmd *pIVar7;
  code *pcVar8;
  void *pvVar9;
  GLboolean GVar10;
  GLboolean GVar11;
  GLboolean GVar12;
  GLboolean GVar13;
  PFNGLENABLEPROC *pp_Var14;
  int fb_height;
  int fb_width;
  long lVar15;
  long lVar16;
  PFNGLENABLEPROC *pp_Var17;
  long lVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  GLuint vertex_array_object;
  GLenum last_blend_equation_alpha;
  GLenum last_blend_equation_rgb;
  GLenum last_blend_dst_alpha;
  GLenum last_blend_src_alpha;
  GLenum last_blend_dst_rgb;
  GLenum last_blend_src_rgb;
  GLint last_vertex_array_object;
  GLint last_array_buffer;
  GLint last_sampler;
  GLint last_texture;
  GLint last_program;
  GLenum last_active_texture;
  GLint last_scissor_box [4];
  GLint last_viewport [4];
  GLint last_polygon_mode [2];
  GLuint local_90;
  float local_8c;
  GLenum local_88;
  GLenum local_84;
  GLenum local_80;
  GLenum local_7c;
  GLenum local_78;
  GLenum local_74;
  GLuint local_70;
  GLuint local_6c;
  GLuint local_68;
  GLuint local_64;
  GLuint local_60;
  GLenum local_5c;
  GLint local_58;
  GLint local_54;
  GLsizei local_50;
  GLsizei local_4c;
  GLint local_48;
  GLint local_44;
  GLsizei local_40;
  GLsizei local_3c;
  GLenum local_38 [2];
  
  fb_width = (int)((draw_data->DisplaySize).x * (draw_data->FramebufferScale).x);
  fb_height = (int)((draw_data->DisplaySize).y * (draw_data->FramebufferScale).y);
  if (0 < fb_height && 0 < fb_width) {
    (*glad_glGetIntegerv)(0x84e0,(GLint *)&local_5c);
    (*glad_glActiveTexture)(0x84c0);
    (*glad_glGetIntegerv)(0x8b8d,(GLint *)&local_60);
    (*glad_glGetIntegerv)(0x8069,(GLint *)&local_64);
    (*glad_glGetIntegerv)(0x8919,(GLint *)&local_68);
    (*glad_glGetIntegerv)(0x8894,(GLint *)&local_6c);
    (*glad_glGetIntegerv)(0x85b5,(GLint *)&local_70);
    (*glad_glGetIntegerv)(0xb40,(GLint *)local_38);
    (*glad_glGetIntegerv)(0xba2,&local_48);
    (*glad_glGetIntegerv)(0xc10,&local_58);
    (*glad_glGetIntegerv)(0x80c9,(GLint *)&local_74);
    (*glad_glGetIntegerv)(0x80c8,(GLint *)&local_78);
    (*glad_glGetIntegerv)(0x80cb,(GLint *)&local_7c);
    (*glad_glGetIntegerv)(0x80ca,(GLint *)&local_80);
    (*glad_glGetIntegerv)(0x8009,(GLint *)&local_84);
    (*glad_glGetIntegerv)(0x883d,(GLint *)&local_88);
    GVar10 = (*glad_glIsEnabled)(0xbe2);
    GVar11 = (*glad_glIsEnabled)(0xb44);
    GVar12 = (*glad_glIsEnabled)(0xb71);
    GVar13 = (*glad_glIsEnabled)(0xc11);
    local_90 = 0;
    (*glad_glGenVertexArrays)(1,&local_90);
    ImGui_ImplOpenGL3_SetupRenderState(draw_data,fb_width,fb_height,local_90);
    if (0 < draw_data->CmdListsCount) {
      fVar1 = (draw_data->DisplayPos).x;
      fVar2 = (draw_data->DisplayPos).y;
      local_8c = (float)fb_width;
      fVar3 = (draw_data->FramebufferScale).x;
      fVar4 = (draw_data->FramebufferScale).y;
      lVar18 = 0;
      do {
        pIVar6 = draw_data->CmdLists[lVar18];
        (*glad_glBufferData)
                  (0x8892,(long)(pIVar6->VtxBuffer).Size * 0x14,(pIVar6->VtxBuffer).Data,0x88e0);
        (*glad_glBufferData)
                  (0x8893,(long)(pIVar6->IdxBuffer).Size * 2,(pIVar6->IdxBuffer).Data,0x88e0);
        if (0 < (pIVar6->CmdBuffer).Size) {
          lVar15 = 0;
          lVar16 = 0;
          do {
            pIVar7 = (pIVar6->CmdBuffer).Data;
            pcVar8 = *(code **)((long)&pIVar7->UserCallback + lVar15);
            if (pcVar8 == (code *)0x0) {
              fVar19 = (*(float *)((long)&(pIVar7->ClipRect).x + lVar15) - fVar1) * fVar3;
              if ((((fVar19 < local_8c) &&
                   (fVar20 = (*(float *)((long)&(pIVar7->ClipRect).y + lVar15) - fVar2) * fVar4,
                   fVar20 < (float)fb_height)) &&
                  (fVar21 = (*(float *)((long)&(pIVar7->ClipRect).z + lVar15) - fVar1) * fVar3,
                  0.0 <= fVar21)) &&
                 (fVar22 = (*(float *)((long)&(pIVar7->ClipRect).w + lVar15) - fVar2) * fVar4,
                 0.0 <= fVar22)) {
                (*glad_glScissor)((int)fVar19,(int)((float)fb_height - fVar22),
                                  (int)(fVar21 - fVar19),(int)(fVar22 - fVar20));
                (*glad_glBindTexture)(0xde1,*(GLuint *)((long)&pIVar7->TextureId + lVar15));
                GVar5 = *(GLsizei *)((long)&pIVar7->ElemCount + lVar15);
                pvVar9 = (void *)((ulong)*(uint *)((long)&pIVar7->IdxOffset + lVar15) * 2);
                if (g_GlVersion < 0x140) {
                  (*glad_glDrawElements)(4,GVar5,0x1403,pvVar9);
                }
                else {
                  (*glad_glDrawElementsBaseVertex)
                            (4,GVar5,0x1403,pvVar9,*(GLint *)((long)&pIVar7->VtxOffset + lVar15));
                }
              }
            }
            else if (pcVar8 == (code *)0xffffffffffffffff) {
              ImGui_ImplOpenGL3_SetupRenderState(draw_data,fb_width,fb_height,local_90);
            }
            else {
              (*pcVar8)(pIVar6,(long)&pIVar7->ElemCount + lVar15);
            }
            lVar16 = lVar16 + 1;
            lVar15 = lVar15 + 0x38;
          } while (lVar16 < (pIVar6->CmdBuffer).Size);
        }
        lVar18 = lVar18 + 1;
      } while (lVar18 < draw_data->CmdListsCount);
    }
    (*glad_glDeleteVertexArrays)(1,&local_90);
    (*glad_glUseProgram)(local_60);
    (*glad_glBindTexture)(0xde1,local_64);
    (*glad_glBindSampler)(0,local_68);
    (*glad_glActiveTexture)(local_5c);
    (*glad_glBindVertexArray)(local_70);
    (*glad_glBindBuffer)(0x8892,local_6c);
    (*glad_glBlendEquationSeparate)(local_84,local_88);
    (*glad_glBlendFuncSeparate)(local_74,local_78,local_7c,local_80);
    pp_Var17 = &glad_glEnable;
    pp_Var14 = &glad_glEnable;
    if (GVar10 == '\0') {
      pp_Var14 = &glad_glDisable;
    }
    (**pp_Var14)(0xbe2);
    pp_Var14 = &glad_glEnable;
    if (GVar11 == '\0') {
      pp_Var14 = &glad_glDisable;
    }
    (**pp_Var14)(0xb44);
    pp_Var14 = &glad_glEnable;
    if (GVar12 == '\0') {
      pp_Var14 = &glad_glDisable;
    }
    (**pp_Var14)(0xb71);
    if (GVar13 == '\0') {
      pp_Var17 = &glad_glDisable;
    }
    (**pp_Var17)(0xc11);
    (*glad_glPolygonMode)(0x408,local_38[0]);
    (*glad_glViewport)(local_48,local_44,local_40,local_3c);
    (*glad_glScissor)(local_58,local_54,local_50,local_4c);
  }
  return;
}

Assistant:

void    ImGui_ImplOpenGL3_RenderDrawData(ImDrawData* draw_data)
{
    // Avoid rendering when minimized, scale coordinates for retina displays (screen coordinates != framebuffer coordinates)
    int fb_width = (int)(draw_data->DisplaySize.x * draw_data->FramebufferScale.x);
    int fb_height = (int)(draw_data->DisplaySize.y * draw_data->FramebufferScale.y);
    if (fb_width <= 0 || fb_height <= 0)
        return;

    // Backup GL state
    GLenum last_active_texture; glGetIntegerv(GL_ACTIVE_TEXTURE, (GLint*)&last_active_texture);
    glActiveTexture(GL_TEXTURE0);
    GLint last_program; glGetIntegerv(GL_CURRENT_PROGRAM, &last_program);
    GLint last_texture; glGetIntegerv(GL_TEXTURE_BINDING_2D, &last_texture);
#ifdef GL_SAMPLER_BINDING
    GLint last_sampler; glGetIntegerv(GL_SAMPLER_BINDING, &last_sampler);
#endif
    GLint last_array_buffer; glGetIntegerv(GL_ARRAY_BUFFER_BINDING, &last_array_buffer);
#ifndef IMGUI_IMPL_OPENGL_ES2
    GLint last_vertex_array_object; glGetIntegerv(GL_VERTEX_ARRAY_BINDING, &last_vertex_array_object);
#endif
#ifdef GL_POLYGON_MODE
    GLint last_polygon_mode[2]; glGetIntegerv(GL_POLYGON_MODE, last_polygon_mode);
#endif
    GLint last_viewport[4]; glGetIntegerv(GL_VIEWPORT, last_viewport);
    GLint last_scissor_box[4]; glGetIntegerv(GL_SCISSOR_BOX, last_scissor_box);
    GLenum last_blend_src_rgb; glGetIntegerv(GL_BLEND_SRC_RGB, (GLint*)&last_blend_src_rgb);
    GLenum last_blend_dst_rgb; glGetIntegerv(GL_BLEND_DST_RGB, (GLint*)&last_blend_dst_rgb);
    GLenum last_blend_src_alpha; glGetIntegerv(GL_BLEND_SRC_ALPHA, (GLint*)&last_blend_src_alpha);
    GLenum last_blend_dst_alpha; glGetIntegerv(GL_BLEND_DST_ALPHA, (GLint*)&last_blend_dst_alpha);
    GLenum last_blend_equation_rgb; glGetIntegerv(GL_BLEND_EQUATION_RGB, (GLint*)&last_blend_equation_rgb);
    GLenum last_blend_equation_alpha; glGetIntegerv(GL_BLEND_EQUATION_ALPHA, (GLint*)&last_blend_equation_alpha);
    GLboolean last_enable_blend = glIsEnabled(GL_BLEND);
    GLboolean last_enable_cull_face = glIsEnabled(GL_CULL_FACE);
    GLboolean last_enable_depth_test = glIsEnabled(GL_DEPTH_TEST);
    GLboolean last_enable_scissor_test = glIsEnabled(GL_SCISSOR_TEST);

    // Setup desired GL state
    // Recreate the VAO every time (this is to easily allow multiple GL contexts to be rendered to. VAO are not shared among GL contexts)
    // The renderer would actually work without any VAO bound, but then our VertexAttrib calls would overwrite the default one currently bound.
    GLuint vertex_array_object = 0;
#ifndef IMGUI_IMPL_OPENGL_ES2
    glGenVertexArrays(1, &vertex_array_object);
#endif
    ImGui_ImplOpenGL3_SetupRenderState(draw_data, fb_width, fb_height, vertex_array_object);

    // Will project scissor/clipping rectangles into framebuffer space
    ImVec2 clip_off = draw_data->DisplayPos;         // (0,0) unless using multi-viewports
    ImVec2 clip_scale = draw_data->FramebufferScale; // (1,1) unless using retina display which are often (2,2)

    // Render command lists
    for (int n = 0; n < draw_data->CmdListsCount; n++)
    {
        const ImDrawList* cmd_list = draw_data->CmdLists[n];

        // Upload vertex/index buffers
        glBufferData(GL_ARRAY_BUFFER, (GLsizeiptr)cmd_list->VtxBuffer.Size * sizeof(ImDrawVert), (const GLvoid*)cmd_list->VtxBuffer.Data, GL_STREAM_DRAW);
        glBufferData(GL_ELEMENT_ARRAY_BUFFER, (GLsizeiptr)cmd_list->IdxBuffer.Size * sizeof(ImDrawIdx), (const GLvoid*)cmd_list->IdxBuffer.Data, GL_STREAM_DRAW);

        for (int cmd_i = 0; cmd_i < cmd_list->CmdBuffer.Size; cmd_i++)
        {
            const ImDrawCmd* pcmd = &cmd_list->CmdBuffer[cmd_i];
            if (pcmd->UserCallback != NULL)
            {
                // User callback, registered via ImDrawList::AddCallback()
                // (ImDrawCallback_ResetRenderState is a special callback value used by the user to request the renderer to reset render state.)
                if (pcmd->UserCallback == ImDrawCallback_ResetRenderState)
                    ImGui_ImplOpenGL3_SetupRenderState(draw_data, fb_width, fb_height, vertex_array_object);
                else
                    pcmd->UserCallback(cmd_list, pcmd);
            }
            else
            {
                // Project scissor/clipping rectangles into framebuffer space
                ImVec4 clip_rect;
                clip_rect.x = (pcmd->ClipRect.x - clip_off.x) * clip_scale.x;
                clip_rect.y = (pcmd->ClipRect.y - clip_off.y) * clip_scale.y;
                clip_rect.z = (pcmd->ClipRect.z - clip_off.x) * clip_scale.x;
                clip_rect.w = (pcmd->ClipRect.w - clip_off.y) * clip_scale.y;

                if (clip_rect.x < fb_width && clip_rect.y < fb_height && clip_rect.z >= 0.0f && clip_rect.w >= 0.0f)
                {
                    // Apply scissor/clipping rectangle
                    glScissor((int)clip_rect.x, (int)(fb_height - clip_rect.w), (int)(clip_rect.z - clip_rect.x), (int)(clip_rect.w - clip_rect.y));

                    // Bind texture, Draw
                    glBindTexture(GL_TEXTURE_2D, (GLuint)(intptr_t)pcmd->TextureId);
#if IMGUI_IMPL_OPENGL_MAY_HAVE_VTX_OFFSET
                    if (g_GlVersion >= 320)
                        glDrawElementsBaseVertex(GL_TRIANGLES, (GLsizei)pcmd->ElemCount, sizeof(ImDrawIdx) == 2 ? GL_UNSIGNED_SHORT : GL_UNSIGNED_INT, (void*)(intptr_t)(pcmd->IdxOffset * sizeof(ImDrawIdx)), (GLint)pcmd->VtxOffset);
                    else
#endif
                    glDrawElements(GL_TRIANGLES, (GLsizei)pcmd->ElemCount, sizeof(ImDrawIdx) == 2 ? GL_UNSIGNED_SHORT : GL_UNSIGNED_INT, (void*)(intptr_t)(pcmd->IdxOffset * sizeof(ImDrawIdx)));
                }
            }
        }
    }

    // Destroy the temporary VAO
#ifndef IMGUI_IMPL_OPENGL_ES2
    glDeleteVertexArrays(1, &vertex_array_object);
#endif

    // Restore modified GL state
    glUseProgram(last_program);
    glBindTexture(GL_TEXTURE_2D, last_texture);
#ifdef GL_SAMPLER_BINDING
    glBindSampler(0, last_sampler);
#endif
    glActiveTexture(last_active_texture);
#ifndef IMGUI_IMPL_OPENGL_ES2
    glBindVertexArray(last_vertex_array_object);
#endif
    glBindBuffer(GL_ARRAY_BUFFER, last_array_buffer);
    glBlendEquationSeparate(last_blend_equation_rgb, last_blend_equation_alpha);
    glBlendFuncSeparate(last_blend_src_rgb, last_blend_dst_rgb, last_blend_src_alpha, last_blend_dst_alpha);
    if (last_enable_blend) glEnable(GL_BLEND); else glDisable(GL_BLEND);
    if (last_enable_cull_face) glEnable(GL_CULL_FACE); else glDisable(GL_CULL_FACE);
    if (last_enable_depth_test) glEnable(GL_DEPTH_TEST); else glDisable(GL_DEPTH_TEST);
    if (last_enable_scissor_test) glEnable(GL_SCISSOR_TEST); else glDisable(GL_SCISSOR_TEST);
#ifdef GL_POLYGON_MODE
    glPolygonMode(GL_FRONT_AND_BACK, (GLenum)last_polygon_mode[0]);
#endif
    glViewport(last_viewport[0], last_viewport[1], (GLsizei)last_viewport[2], (GLsizei)last_viewport[3]);
    glScissor(last_scissor_box[0], last_scissor_box[1], (GLsizei)last_scissor_box[2], (GLsizei)last_scissor_box[3]);
}